

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void transmaskwallscan(int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
                      double yrepeat,_func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  float fVar5;
  fixed_t fVar6;
  short *psVar7;
  short *psVar8;
  bool bVar9;
  DWORD DVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  BYTE *pBVar15;
  ulong uVar16;
  long lVar17;
  long unaff_R12;
  int unaff_R13D;
  BYTE *pBVar18;
  long lVar19;
  byte bVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  float local_100;
  _func_fixed_t *tmvline1;
  BYTE *local_e8;
  double local_e0;
  int local_d8 [4];
  int local_c8 [6];
  short *local_b0;
  short *local_a8;
  float *local_a0;
  fixed_t *local_98;
  long local_90;
  fixed_t *local_88;
  double local_80;
  float *local_78;
  fixed_t *local_70;
  BYTE *local_68;
  short *local_60;
  short *local_58;
  long local_50;
  long local_48;
  float *local_40;
  _func_void *tmvline4;
  
  if (rw_pic->UseType != '\r') {
    local_100 = rw_light - rw_lightstep;
    local_e0 = yrepeat;
    local_b0 = uwal;
    local_a8 = dwal;
    local_a0 = swal;
    local_98 = lwal;
    bVar9 = R_GetTransMaskDrawers(&tmvline1,&tmvline4);
    if (bVar9) {
      iVar12 = 0x20 - (uint)rw_pic->HeightBits;
      setuptmvline(iVar12);
      fVar6 = rw_offset;
      lVar19 = (long)x1;
      pBVar15 = dc_destorg + lVar19;
      bVar9 = fixedcolormap != (lighttable_t *)0x0;
      bVar22 = -1 < fixedlightlev;
      local_e8 = basecolormap->Maps;
      if (bVar22 || bVar9) {
        palookupoffse[1]._0_4_ = (int)dc_colormap;
        palookupoffse[0] = dc_colormap;
        palookupoffse[1]._4_4_ = (int)((ulong)dc_colormap >> 0x20);
        palookupoffse._16_16_ = palookupoffse._0_16_;
      }
      local_80 = 6755399441055744.0 / (double)(1 << ((byte)iVar12 & 0x1f));
      local_50 = (long)x2;
      local_58 = local_b0 + lVar19;
      local_60 = local_a8 + lVar19;
      local_70 = local_98 + lVar19;
      local_78 = local_a0 + lVar19;
      lVar14 = 0;
      for (lVar21 = 0;
          (lVar17 = lVar19 + lVar21, lVar17 < local_50 && (((int)lVar21 + (int)pBVar15 & 3U) != 0));
          lVar21 = lVar21 + 1) {
        local_100 = local_100 + rw_lightstep;
        sVar2 = local_58[lVar21];
        unaff_R12 = (long)sVar2;
        unaff_R13D = (int)local_60[lVar21];
        if (sVar2 < local_60[lVar21]) {
          if (!bVar22 && !bVar9) {
            dVar23 = (double)local_100;
            if (24.0 <= dVar23) {
              dVar23 = 24.0;
            }
            iVar12 = wallshade - SUB84(dVar23 + 103079215104.0,0) >> 0x10;
            if (0x1e < iVar12) {
              iVar12 = 0x1f;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            dc_colormap = local_e8 + (uint)(iVar12 << 8);
          }
          dc_source = (*getcol)(rw_pic,local_70[lVar21] + fVar6 >> 0x10);
          dc_dest = pBVar15 + ylookup[unaff_R12] + lVar21;
          dc_count = unaff_R13D - sVar2;
          dc_iscale = SUB84((double)local_78[lVar21] * local_e0 + local_80,0);
          dc_texturefrac =
               SUB84(dc_texturemid + local_80 +
                     (((double)(int)sVar2 + 0.5) - CenterY) * (double)local_78[lVar21] * local_e0,0)
          ;
          (*tmvline1)();
        }
        lVar14 = lVar14 + 2;
      }
      local_c8[0] = (int)unaff_R12;
      local_d8[0] = unaff_R13D;
      iVar12 = x1 + 3 + (int)lVar21;
      pBVar15 = pBVar15 + lVar21;
      pBVar18 = local_e8;
      while (psVar8 = local_a8, psVar7 = local_b0, (int)lVar17 < x2 + -3) {
        local_90 = lVar17;
        local_48 = lVar14;
        local_68 = pBVar15;
        local_88 = local_98 + iVar12;
        local_40 = local_a0 + iVar12;
        lVar19 = 0;
        bVar20 = 0;
        while( true ) {
          pBVar15 = local_68;
          pBVar18 = local_e8;
          fVar5 = rw_lightstep;
          iVar4 = wallshade;
          uVar1 = lVar19 + 3;
          if ((int)uVar1 < 0) break;
          sVar2 = psVar7[iVar12 + lVar19];
          uVar16 = uVar1 & 0xffffffff;
          local_c8[uVar16] = (int)sVar2;
          sVar3 = psVar8[iVar12 + lVar19];
          local_d8[uVar16] = (int)sVar3;
          if (sVar2 < sVar3) {
            pBVar15 = (*getcol)(rw_pic,local_88[lVar19] + fVar6 >> 0x10);
            bufplce[uVar16] = pBVar15;
            dVar23 = (double)local_40[lVar19] * local_e0 + local_80;
            vince[uVar16] = SUB84(dVar23,0);
            vplce[uVar16] =
                 SUB84(dc_texturemid + local_80 +
                       (((double)(int)sVar2 + 0.5) - CenterY) * (double)((ulong)dVar23 & 0xffffffff)
                       ,0);
          }
          else {
            bVar20 = bVar20 + (char)(1 << ((byte)uVar1 & 0x1f));
          }
          lVar19 = lVar19 + -1;
        }
        if (bVar20 == 0xf) {
          local_100 = local_100 + rw_lightstep * 4.0;
        }
        else {
          if (!bVar22 && !bVar9) {
            for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
              local_100 = local_100 + fVar5;
              dVar23 = (double)local_100;
              if (24.0 <= dVar23) {
                dVar23 = 24.0;
              }
              iVar11 = iVar4 - SUB84(dVar23 + 103079215104.0,0) >> 0x10;
              if (0x1e < iVar11) {
                iVar11 = 0x1f;
              }
              if (iVar11 < 1) {
                iVar11 = 0;
              }
              palookupoffse[lVar19] = local_e8 + (uint)(iVar11 << 8);
            }
          }
          iVar4 = local_c8[1];
          if (local_c8[1] < local_c8[0]) {
            iVar4 = local_c8[0];
          }
          iVar11 = local_c8[3];
          if (local_c8[3] < local_c8[2]) {
            iVar11 = local_c8[2];
          }
          if (iVar11 < iVar4) {
            iVar11 = iVar4;
          }
          iVar4 = local_d8[1];
          if (local_d8[0] < local_d8[1]) {
            iVar4 = local_d8[0];
          }
          iVar13 = local_d8[3];
          if (local_d8[2] < local_d8[3]) {
            iVar13 = local_d8[2];
          }
          if (iVar4 < iVar13) {
            iVar13 = iVar4;
          }
          if ((bVar20 == 0) && (iVar13 - iVar11 != 0 && iVar11 <= iVar13)) {
            local_88 = (fixed_t *)CONCAT44(local_88._4_4_,iVar13 - iVar11);
            for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
              iVar4 = local_c8[lVar19];
              if (iVar4 < iVar11) {
                dc_count = iVar11 - iVar4;
                dc_dest = pBVar15 + lVar19 + ylookup[iVar4];
                dc_iscale = vince[lVar19];
                dc_colormap = palookupoffse[lVar19];
                dc_texturefrac = vplce[lVar19];
                dc_source = bufplce[lVar19];
                DVar10 = (*tmvline1)();
                vplce[lVar19] = DVar10;
              }
            }
            dc_count = (int)local_88;
            dc_dest = pBVar15 + ylookup[iVar11];
            (*tmvline4)();
            iVar4 = ylookup[iVar13];
            for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
              iVar11 = local_d8[lVar19] - iVar13;
              if (iVar11 != 0 && iVar13 <= local_d8[lVar19]) {
                dc_iscale = vince[lVar19];
                dc_colormap = palookupoffse[0];
                dc_texturefrac = vplce[lVar19];
                dc_source = bufplce[lVar19];
                dc_dest = pBVar15 + lVar19 + iVar4;
                dc_count = iVar11;
                (*tmvline1)();
              }
            }
          }
          else {
            for (lVar19 = 0; lVar19 != 4; lVar19 = lVar19 + 1) {
              if ((bVar20 & 1) == 0) {
                dc_count = local_d8[lVar19] - local_c8[lVar19];
                dc_dest = pBVar15 + lVar19 + ylookup[local_c8[lVar19]];
                dc_iscale = vince[lVar19];
                dc_colormap = palookupoffse[lVar19];
                dc_texturefrac = vplce[lVar19];
                dc_source = bufplce[lVar19];
                (*tmvline1)();
              }
              bVar20 = (char)bVar20 >> 1;
            }
          }
        }
        pBVar15 = pBVar15 + 4;
        iVar12 = iVar12 + 4;
        lVar14 = local_48 + 8;
        lVar17 = local_90 + 4;
      }
      for (; lVar17 < local_50; lVar17 = lVar17 + 1) {
        local_100 = local_100 + rw_lightstep;
        sVar2 = *(short *)((long)local_58 + lVar14);
        sVar3 = *(short *)((long)local_60 + lVar14);
        if (sVar2 < sVar3) {
          if (!bVar22 && !bVar9) {
            dVar23 = (double)local_100;
            if (24.0 <= dVar23) {
              dVar23 = 24.0;
            }
            iVar12 = wallshade - SUB84(dVar23 + 103079215104.0,0) >> 0x10;
            if (0x1e < iVar12) {
              iVar12 = 0x1f;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            dc_colormap = pBVar18 + (uint)(iVar12 << 8);
          }
          dc_source = (*getcol)(rw_pic,*(int *)((long)local_70 + lVar14 * 2) + fVar6 >> 0x10);
          dc_dest = pBVar15 + ylookup[sVar2];
          dc_count = (int)sVar3 - (int)sVar2;
          dVar23 = (double)*(float *)((long)local_78 + lVar14 * 2) * local_e0;
          dc_iscale = SUB84(dVar23 + local_80,0);
          dc_texturefrac =
               SUB84(dc_texturemid + local_80 + (((double)(int)sVar2 + 0.5) - CenterY) * dVar23,0);
          (*tmvline1)();
        }
        pBVar15 = pBVar15 + 1;
        lVar14 = lVar14 + 2;
      }
      NetUpdate();
    }
    else {
      maskwallscan(x1,x2,local_b0,local_a8,local_a0,local_98,local_e0,getcol);
    }
  }
  return;
}

Assistant:

void transmaskwallscan (int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal,
	double yrepeat, const BYTE *(*getcol)(FTexture *tex, int x))
{
	fixed_t (*tmvline1)();
	void (*tmvline4)();
	int x, fracbits;
	BYTE *p;
	int y1ve[4], y2ve[4], u4, d4, startx, dax, z;
	char bad;
	float light = rw_light - rw_lightstep;
	SDWORD xoffset;
	BYTE *basecolormapdata;
	double iscale;

	if (rw_pic->UseType == FTexture::TEX_Null)
	{
		return;
	}

	if (!R_GetTransMaskDrawers (&tmvline1, &tmvline4))
	{
		// The current translucency is unsupported, so draw with regular maskwallscan instead.
		maskwallscan (x1, x2, uwal, dwal, swal, lwal, yrepeat, getcol);
		return;
	}

//extern cycle_t WallScanCycles;
//clock (WallScanCycles);

	rw_pic->GetHeight();	// Make sure texture size is loaded
	fracbits = 32 - rw_pic->HeightBits;
	setuptmvline(fracbits);
	xoffset = rw_offset;
	basecolormapdata = basecolormap->Maps;
	fixed_t centeryfrac = FLOAT2FIXED(CenterY);

	x = startx = x1;
	p = x + dc_destorg;

	bool fixed = (fixedcolormap != NULL || fixedlightlev >= 0);
	if (fixed)
	{
		palookupoffse[0] = dc_colormap;
		palookupoffse[1] = dc_colormap;
		palookupoffse[2] = dc_colormap;
		palookupoffse[3] = dc_colormap;
	}

	for(; (x < x2) && ((size_t)p & 3); ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];//max(uwal[x],umost[x]);
		y2ve[0] = dwal[x];//min(dwal[x],dmost[x]);
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

	for(; x < x2-3; x += 4, p+= 4)
	{
		bad = 0;
		for (z = 3, dax = x+3; z >= 0; --z, --dax)
		{
			y1ve[z] = uwal[dax];
			y2ve[z] = dwal[dax];
			if (y2ve[z] <= y1ve[z]) { bad += 1<<z; continue; }

			bufplce[z] = getcol (rw_pic, (lwal[dax] + xoffset) >> FRACBITS);
			iscale = swal[dax] * yrepeat;
			vince[z] = xs_ToFixed(fracbits, iscale);
			vplce[z] = xs_ToFixed(fracbits, dc_texturemid + vince[z] * (y1ve[z] - CenterY + 0.5));
		}
		if (bad == 15)
		{
			light += rw_lightstep * 4;
			continue;
		}

		if (!fixed)
		{
			for (z = 0; z < 4; ++z)
			{
				light += rw_lightstep;
				palookupoffse[z] = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
			}
		}

		u4 = MAX(MAX(y1ve[0],y1ve[1]),MAX(y1ve[2],y1ve[3]));
		d4 = MIN(MIN(y2ve[0],y2ve[1]),MIN(y2ve[2],y2ve[3]));

		if ((bad != 0) || (u4 >= d4))
		{
			for (z = 0; z < 4; ++z)
			{
				if (!(bad & 1))
				{
					preptmvline1(vince[z],palookupoffse[z],y2ve[z]-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
					tmvline1();
				}
				bad >>= 1;
			}
			continue;
		}

		for (z = 0; z < 4; ++z)
		{
			if (u4 > y1ve[z])
			{
				preptmvline1(vince[z],palookupoffse[z],u4-y1ve[z],vplce[z],bufplce[z],ylookup[y1ve[z]]+p+z);
				vplce[z] = tmvline1();
			}
		}

		if (d4 > u4)
		{
			dc_count = d4-u4;
			dc_dest = ylookup[u4]+p;
			tmvline4();
		}

		BYTE *i = p+ylookup[d4];
		for (z = 0; z < 4; ++z)
		{
			if (y2ve[z] > d4)
			{
				preptmvline1(vince[z],palookupoffse[0],y2ve[z]-d4,vplce[z],bufplce[z],i+z);
				tmvline1();
			}
		}
	}
	for(; x < x2; ++x, ++p)
	{
		light += rw_lightstep;
		y1ve[0] = uwal[x];
		y2ve[0] = dwal[x];
		if (y2ve[0] <= y1ve[0]) continue;

		if (!fixed)
		{ // calculate lighting
			dc_colormap = basecolormapdata + (GETPALOOKUP (light, wallshade) << COLORMAPSHIFT);
		}

		dc_source = getcol (rw_pic, (lwal[x] + xoffset) >> FRACBITS);
		dc_dest = ylookup[y1ve[0]] + p;
		dc_count = y2ve[0] - y1ve[0];
		iscale = swal[x] * yrepeat;
		dc_iscale = xs_ToFixed(fracbits, iscale);
		dc_texturefrac = xs_ToFixed(fracbits, dc_texturemid + iscale * (y1ve[0] - CenterY + 0.5));

		tmvline1();
	}

//unclock(WallScanCycles);

	NetUpdate ();
}